

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  uint data_width;
  uint data_height;
  int iVar1;
  int iVar2;
  int height;
  int line_order;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  EXRChannelInfo *pEVar6;
  EXRAttribute *attributes;
  int num_lines;
  int width;
  bool bVar7;
  bool bVar8;
  int c;
  ostream *poVar9;
  EXRTile *pEVar10;
  size_t sVar11;
  uchar **ppuVar12;
  long lVar13;
  unsigned_long uVar14;
  int iVar15;
  pointer *channel_offset_list_00;
  ulong uVar16;
  size_t __nmemb;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uchar *puVar20;
  int iVar21;
  size_t y_idx;
  int *piVar22;
  int iVar23;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar24;
  undefined4 in_stack_fffffffffffffd78;
  int num_channels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list_01;
  string local_250 [32];
  size_t local_230;
  ulong local_228;
  uchar *local_220;
  size_t local_218;
  int local_20c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [376];
  
  iVar21 = exr_header->compression_type;
  pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10;
  if ((iVar21 != 3) && (iVar21 != 0x80)) {
    if (iVar21 == 4) {
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20;
    }
    else {
      pvVar24 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    }
  }
  iVar23 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar21 = exr_header->data_window[3] - exr_header->data_window[1];
  data_width = iVar23 + 1;
  data_height = iVar21 + 1;
  if (iVar21 < -1 || iVar23 < -1) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"Invalid data width or data height: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_width);
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_height);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
LAB_001334d2:
    std::__cxx11::string::~string(local_250);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return -4;
  }
  if (0x7fffff < iVar23 || 0x7fffff < iVar21) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"data_with or data_height too large. data_width: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_width);
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = std::operator<<(poVar9,"data_height = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_height);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
    goto LAB_001334d2;
  }
  num_channels = exr_header->num_channels;
  puVar4 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = (ulong)num_channels;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar6 = exr_header->channels;
  local_220 = head;
  local_218 = size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar16);
  local_228 = (ulong)((long)puVar4 - (long)puVar5) >> 3;
  piVar22 = &pEVar6->pixel_type;
  uVar14 = 0;
  iVar15 = 0;
  for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
    channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar18] = uVar14;
    uVar19 = (ulong)(uint)*piVar22;
    if (2 < uVar19) {
      if (uVar18 < uVar16) {
        iVar17 = -4;
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        goto LAB_00133b4b;
      }
      break;
    }
    iVar15 = iVar15 + *(int *)(&DAT_001783a0 + uVar19 * 4);
    uVar14 = uVar14 + *(long *)(&DAT_001783b0 + uVar19 * 8);
    piVar22 = piVar22 + 0x44;
  }
  if (exr_header->tiled == 0) {
    if (data_width * uVar16 * (ulong)data_height - 0x4000000000 < 0xffffffc000000001) {
      iVar17 = -4;
      if (err == (string *)0x0) goto LAB_00133b4b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar9 = std::operator<<(local_1a8,"Image data size is zero or too large: width = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_width);
      poVar9 = std::operator<<(poVar9,", height = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,data_height);
      poVar9 = std::operator<<(poVar9,", channels = ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,num_channels);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
      goto LAB_00133aa0;
    }
    ppuVar12 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                             data_width,data_height);
    exr_image->images = ppuVar12;
    local_230 = (size_t)iVar15;
    uVar18 = 0;
    uVar16 = local_228 & 0xffffffff;
    if ((int)local_228 < 1) {
      uVar16 = uVar18;
    }
    bVar7 = false;
    uVar19 = local_218;
    puVar20 = local_220;
    channel_offset_list_01 = pvVar24;
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      uVar14 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar18];
      bVar8 = true;
      if (uVar14 + 8 <= uVar19) {
        iVar21 = *(int *)(puVar20 + uVar14 + 4);
        if ((ulong)(long)iVar21 <= uVar19 - (uVar14 + 8)) {
          iVar23 = *(int *)(puVar20 + uVar14);
          if (iVar21 != 0 && 0xffbffffe < iVar23 - 0x200001U) {
            iVar17 = iVar23 + (int)pvVar24;
            iVar15 = exr_header->data_window[3] + 1;
            if (iVar17 <= iVar15) {
              iVar15 = iVar17;
            }
            if (((iVar15 - iVar23 != 0 && iVar23 <= iVar15) &&
                (pvVar24 = channel_offset_list_01,
                0xffffffff00000000 < ((long)iVar23 - (long)exr_header->data_window[1]) - 0x80000000U
                )) && (iVar17 = iVar23 - exr_header->data_window[1], -1 < iVar17)) {
              bVar8 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                      puVar20 + uVar14 + 8,(long)iVar21,exr_header->compression_type
                                      ,exr_header->line_order,data_width,data_height,data_width,
                                      (int)uVar18,iVar17,iVar15 - iVar23,local_230,
                                      (long)exr_header->num_channels,
                                      (EXRAttribute *)exr_header->channels,
                                      (size_t)&channel_offset_list,
                                      (EXRChannelInfo *)
                                      CONCAT44(num_channels,in_stack_fffffffffffffd78),
                                      channel_offset_list_01);
              uVar19 = local_218;
              puVar20 = local_220;
              channel_offset_list_01 = pvVar24;
              bVar8 = (bool)(!bVar8 | bVar7);
            }
          }
        }
      }
      bVar7 = bVar8;
    }
    if (!bVar7) goto LAB_00133aed;
    iVar17 = -4;
    if (err == (string *)0x0) goto LAB_00133b4b;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::append((char *)err);
  }
  else {
    if (exr_header->tile_size_x < 0) {
      iVar17 = -9;
      if (err == (string *)0x0) goto LAB_00133b4b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar9 = std::operator<<(local_1a8,"Invalid tile size x : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_x);
      std::operator<<(poVar9,"\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
    }
    else {
      if (-1 < exr_header->tile_size_y) {
        __nmemb = (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
        pEVar10 = (EXRTile *)calloc(__nmemb,0x20);
        exr_image->tiles = pEVar10;
        channel_offset_list_00 = (pointer *)0x0;
        iVar17 = 0;
        sVar11 = __nmemb;
        while (sVar11 != 0) {
          local_228 = sVar11 - 1;
          ppuVar12 = AllocateImage(num_channels,exr_header->channels,
                                   exr_header->requested_pixel_types,exr_header->tile_size_x,
                                   exr_header->tile_size_y);
          pEVar10 = exr_image->tiles;
          *(uchar ***)((long)&pEVar10->images + (long)channel_offset_list_00 * 4) = ppuVar12;
          lVar13 = *(long *)((long)(offsets->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start +
                            (long)channel_offset_list_00);
          if (local_218 < lVar13 + 0x14U) {
            iVar17 = -4;
            if (err != (string *)0x0) {
              std::__cxx11::string::append((char *)err);
            }
            goto LAB_00133b4b;
          }
          if (*(int *)(local_220 + lVar13 + 0xc) != 0 || *(int *)(local_220 + lVar13 + 8) != 0) {
            iVar17 = -10;
            goto LAB_00133b4b;
          }
          uVar16 = (ulong)*(int *)(local_220 + lVar13 + 0x10);
          if (((long)uVar16 < 4) || (local_218 - (lVar13 + 0x14U) < uVar16)) {
            iVar17 = -4;
            if (err != (string *)0x0) {
              std::__cxx11::string::append((char *)err);
            }
            goto LAB_00133b4b;
          }
          local_230 = CONCAT44(local_230._4_4_,iVar17);
          iVar1 = *(int *)(local_220 + lVar13);
          iVar17 = exr_header->tile_size_x;
          if (iVar23 < iVar17 * iVar1) {
            __assert_fail("tile_offset_x * tile_size_x < data_width",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x2852,
                          "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                         );
          }
          iVar2 = *(int *)(local_220 + lVar13 + 4);
          height = exr_header->tile_size_y;
          if (iVar21 < height * iVar2) {
            __assert_fail("tile_offset_y * tile_size_y < data_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x2853,
                          "bool tinyexr::DecodeTiledPixelData(unsigned char **, int *, int *, const int *, const unsigned char *, size_t, int, int, int, int, int, int, int, int, size_t, size_t, const EXRAttribute *, size_t, const EXRChannelInfo *, const std::vector<size_t> &)"
                         );
          }
          piVar22 = exr_header->requested_pixel_types;
          local_20c = exr_header->compression_type;
          line_order = exr_header->line_order;
          iVar3 = exr_header->num_channels;
          width = data_width - iVar17 * iVar1;
          if ((iVar1 + 1) * iVar17 <= iVar23) {
            width = iVar17;
          }
          attributes = (EXRAttribute *)exr_header->channels;
          (&pEVar10->width)[(long)channel_offset_list_00] = width;
          num_lines = data_height - height * iVar2;
          if ((iVar2 + 1) * height <= iVar21) {
            num_lines = height;
          }
          (&pEVar10->height)[(long)channel_offset_list_00] = num_lines;
          bVar7 = DecodePixelData(ppuVar12,piVar22,local_220 + lVar13 + 0x14,uVar16,local_20c,
                                  line_order,width,height,iVar17,0,0,num_lines,(long)iVar15,
                                  (long)iVar3,attributes,(size_t)&channel_offset_list,
                                  (EXRChannelInfo *)CONCAT44(num_channels,in_stack_fffffffffffffd78)
                                  ,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   channel_offset_list_00);
          iVar17 = (int)local_230;
          if (!bVar7) {
            iVar17 = -4;
          }
          if (err != (string *)0x0 && !bVar7) {
            std::__cxx11::string::append((char *)err);
            iVar17 = -4;
          }
          pEVar10 = exr_image->tiles;
          (&pEVar10->offset_x)[(long)channel_offset_list_00] = iVar1;
          (&pEVar10->offset_y)[(long)channel_offset_list_00] = iVar2;
          *(undefined8 *)(&pEVar10->level_x + (long)channel_offset_list_00) = 0;
          channel_offset_list_00 =
               &(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)channel_offset_list_00)->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
          sVar11 = local_228;
        }
        if (iVar17 != 0) goto LAB_00133b4b;
        exr_image->num_tiles = (int)__nmemb;
LAB_00133aed:
        for (lVar13 = 0; lVar13 < exr_header->num_channels; lVar13 = lVar13 + 1) {
          exr_header->pixel_types[lVar13] = exr_header->requested_pixel_types[lVar13];
        }
        exr_image->num_channels = num_channels;
        exr_image->width = data_width;
        exr_image->height = data_height;
        iVar17 = 0;
        goto LAB_00133b4b;
      }
      iVar17 = -9;
      if (err == (string *)0x0) goto LAB_00133b4b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar9 = std::operator<<(local_1a8,"Invalid tile size y : ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_y);
      std::operator<<(poVar9,"\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
    }
LAB_00133aa0:
    std::__cxx11::string::~string(local_250);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_00133b4b:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  return iVar17;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  if ((data_width < 0) || (data_height < 0)) {
    if (err) {
      std::stringstream ss;
      ss << "Invalid data width or data height: " << data_width << ", "
         << data_height << std::endl;
      (*err) += ss.str();
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(static_cast<size_t>(num_tiles), sizeof(EXRTile)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
          tinyexr::swap4(
              reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
            tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window[3] + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window[1]);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window[1];
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}